

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_property_behavior
               (nk_flags *ws,nk_input *in,nk_rect property,nk_rect label,nk_rect edit,nk_rect empty,
               int *state,nk_property_variant *variant,float inc_per_pixel)

{
  int iVar1;
  nk_property_variant *variant_local;
  int *state_local;
  nk_input *in_local;
  nk_flags *ws_local;
  nk_rect empty_local;
  nk_rect edit_local;
  nk_rect label_local;
  nk_rect property_local;
  
  if ((in != (nk_input *)0x0) && (*state == 0)) {
    iVar1 = nk_button_behavior(ws,edit,in,NK_BUTTON_DEFAULT);
    if (iVar1 == 0) {
      iVar1 = nk_input_is_mouse_click_down_in_rect(in,NK_BUTTON_LEFT,label,1);
      if (iVar1 == 0) {
        iVar1 = nk_input_is_mouse_click_down_in_rect(in,NK_BUTTON_LEFT,empty,1);
        if (iVar1 != 0) {
          *state = 2;
        }
      }
      else {
        *state = 2;
      }
    }
    else {
      *state = 1;
    }
  }
  if ((*state == 2) && (nk_drag_behavior(ws,in,property,variant,inc_per_pixel), (*ws & 0x20) == 0))
  {
    *state = 0;
  }
  return;
}

Assistant:

NK_LIB void
nk_property_behavior(nk_flags *ws, const struct nk_input *in,
    struct nk_rect property,  struct nk_rect label, struct nk_rect edit,
    struct nk_rect empty, int *state, struct nk_property_variant *variant,
    float inc_per_pixel)
{
    if (in && *state == NK_PROPERTY_DEFAULT) {
        if (nk_button_behavior(ws, edit, in, NK_BUTTON_DEFAULT))
            *state = NK_PROPERTY_EDIT;
        else if (nk_input_is_mouse_click_down_in_rect(in, NK_BUTTON_LEFT, label, nk_true))
            *state = NK_PROPERTY_DRAG;
        else if (nk_input_is_mouse_click_down_in_rect(in, NK_BUTTON_LEFT, empty, nk_true))
            *state = NK_PROPERTY_DRAG;
    }
    if (*state == NK_PROPERTY_DRAG) {
        nk_drag_behavior(ws, in, property, variant, inc_per_pixel);
        if (!(*ws & NK_WIDGET_STATE_ACTIVED)) *state = NK_PROPERTY_DEFAULT;
    }
}